

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxPlatformMisc.cpp
# Opt level: O1

Uint64 Diligent::LinuxMisc::SetCurrentThreadAffinity(Uint64 Mask)

{
  int iVar1;
  pthread_t __th;
  ulong uVar2;
  Uint32 j;
  ulong uVar3;
  Uint64 UVar4;
  ulong uVar5;
  cpu_set_t CPUSet;
  cpu_set_t local_98;
  
  __th = pthread_self();
  iVar1 = pthread_getaffinity_np(__th,0x80,&local_98);
  if (iVar1 == 0) {
    uVar2 = 0;
    uVar5 = 0;
    do {
      uVar3 = 0;
      if ((local_98.__bits[0] >> (uVar2 & 0x3f) & 1) != 0) {
        uVar3 = 1L << ((byte)uVar2 & 0x3f);
      }
      uVar5 = uVar5 | uVar3;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x40);
  }
  else {
    uVar5 = 0;
  }
  local_98.__bits[0xe] = 0;
  local_98.__bits[0xf] = 0;
  local_98.__bits[0xc] = 0;
  local_98.__bits[0xd] = 0;
  local_98.__bits[10] = 0;
  local_98.__bits[0xb] = 0;
  local_98.__bits[8] = 0;
  local_98.__bits[9] = 0;
  local_98.__bits[6] = 0;
  local_98.__bits[7] = 0;
  local_98.__bits[4] = 0;
  local_98.__bits[5] = 0;
  local_98.__bits[2] = 0;
  local_98.__bits[3] = 0;
  local_98.__bits[0] = 0;
  local_98.__bits[1] = 0;
  uVar3 = 0;
  uVar2 = 0;
  do {
    if ((Mask >> (uVar3 & 0x3f) & 1) != 0) {
      uVar2 = uVar2 | 1L << ((byte)uVar3 & 0x3f);
      local_98.__bits[0] = uVar2;
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x40);
  iVar1 = pthread_setaffinity_np(__th,0x80,&local_98);
  UVar4 = 0;
  if (iVar1 == 0) {
    UVar4 = uVar5;
  }
  return UVar4;
}

Assistant:

Uint64 LinuxMisc::SetCurrentThreadAffinity(Uint64 Mask)
{
    const auto CurrThread = pthread_self();

    Uint64 CurrAffinity = 0;

    cpu_set_t CPUSet;
    if (pthread_getaffinity_np(CurrThread, sizeof(CPUSet), &CPUSet) == 0)
    {
        for (Uint32 j = 0; j < 64; ++j)
        {
            if (CPU_ISSET(j, &CPUSet))
                CurrAffinity |= Uint64{1} << j;
        }
    }

    CPU_ZERO(&CPUSet);
    for (Uint32 j = 0; j < 64; j++)
    {
        if (Mask & (Uint64{1} << j))
            CPU_SET(j, &CPUSet);
    }

    if (pthread_setaffinity_np(CurrThread, sizeof(CPUSet), &CPUSet) == 0)
        return CurrAffinity;
    else
        return 0;
}